

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O2

void __thiscall Parser::FinishBackgroundRegExpNodes(Parser *this)

{
  NodeDList *pNVar1;
  RegexPattern *pRVar2;
  code *pcVar3;
  NodeDList *pNVar4;
  bool bVar5;
  bool bVar6;
  undefined4 *puVar7;
  ParseNode **ppPVar8;
  ParseNodeRegExp *pPVar9;
  ParseNode **ppPVar10;
  ParseNode *pPVar11;
  ParseNode *this_00;
  BackgroundParseItem **ppBVar12;
  BackgroundParseItem *pBVar13;
  Iterator local_58;
  BackgroundParseItem *local_48;
  Iterator local_40;
  
  if (this->m_isInBackground == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                       ,0x2b0,"(!this->IsBackgroundParser())","!this->IsBackgroundParser()");
    if (!bVar5) goto LAB_00ce389e;
    *puVar7 = 0;
  }
  if (this->fastScannedRegExpNodes == (NodeDList *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                       ,0x2b1,"(this->fastScannedRegExpNodes)","this->fastScannedRegExpNodes");
    if (!bVar5) goto LAB_00ce389e;
    *puVar7 = 0;
  }
  if (this->backgroundParseItems == (BackgroundParseItem *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                       ,0x2b2,"(this->backgroundParseItems != nullptr)",
                       "this->backgroundParseItems != nullptr");
    if (!bVar5) {
LAB_00ce389e:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar7 = 0;
  }
  else {
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  }
  ppBVar12 = &this->backgroundParseItems;
  local_48 = (BackgroundParseItem *)ppBVar12;
  while (pBVar13 = *ppBVar12, pBVar13 != (BackgroundParseItem *)0x0) {
    local_40.list = &pBVar13->regExpNodes->super_DListBase<ParseNode_*,_RealCount>;
    local_40.current = &(local_40.list)->super_DListNodeBase<ParseNode_*>;
    if ((NodeDList *)local_40.list != (NodeDList *)0x0) {
      while( true ) {
        if ((NodeDList *)local_40.current == (NodeDList *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar7 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                             ,0x66,"(current != nullptr)","current != nullptr");
          if (!bVar5) goto LAB_00ce389e;
          *puVar7 = 0;
        }
        local_40.current =
             (((NodeDList *)local_40.current)->super_DListBase<ParseNode_*,_RealCount>).
             super_DListNodeBase<ParseNode_*>.next.base;
        if ((DListBase<ParseNode_*,_RealCount> *)local_40.current == local_40.list) break;
        ppPVar8 = DListBase<ParseNode_*,_RealCount>::Iterator::Data(&local_40);
        pPVar9 = ParseNode::AsParseNodeRegExp(*ppPVar8);
        if (pPVar9->regexPattern != (RegexPattern *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar7 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                             ,0x2bf,"(pnode->AsParseNodeRegExp()->regexPattern == nullptr)",
                             "pnode->AsParseNodeRegExp()->regexPattern == nullptr");
          if (!bVar5) goto LAB_00ce389e;
          *puVar7 = 0;
        }
      }
    }
    ppBVar12 = &pBVar13->nextItem;
  }
  pBVar13 = this->backgroundParseItems;
  local_40.list = &this->fastScannedRegExpNodes->super_DListBase<ParseNode_*,_RealCount>;
  local_40.current = &(local_40.list)->super_DListNodeBase<ParseNode_*>;
LAB_00ce353c:
  if ((NodeDList *)local_40.current == (NodeDList *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                       ,0x66,"(current != nullptr)","current != nullptr");
    if (!bVar5) goto LAB_00ce389e;
    *puVar7 = 0;
  }
  local_40.current =
       (((NodeDList *)local_40.current)->super_DListBase<ParseNode_*,_RealCount>).
       super_DListNodeBase<ParseNode_*>.next.base;
  if ((DListBase<ParseNode_*,_RealCount> *)local_40.current == local_40.list) {
    do {
      local_48 = (BackgroundParseItem *)
                 (local_48->super_Job).
                 super_DoublyLinkedListElement<JsUtil::Job,_Memory::ArenaAllocator>.previous;
      if (local_48 == (BackgroundParseItem *)0x0) {
        return;
      }
      local_40.list = &local_48->regExpNodes->super_DListBase<ParseNode_*,_RealCount>;
      local_40.current = &(local_40.list)->super_DListNodeBase<ParseNode_*>;
      if ((NodeDList *)local_40.list != (NodeDList *)0x0) {
        while( true ) {
          if ((NodeDList *)local_40.current == (NodeDList *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar7 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                               ,0x66,"(current != nullptr)","current != nullptr");
            if (!bVar5) goto LAB_00ce389e;
            *puVar7 = 0;
          }
          local_40.current =
               (((NodeDList *)local_40.current)->super_DListBase<ParseNode_*,_RealCount>).
               super_DListNodeBase<ParseNode_*>.next.base;
          if ((DListBase<ParseNode_*,_RealCount> *)local_40.current == local_40.list) break;
          ppPVar8 = DListBase<ParseNode_*,_RealCount>::Iterator::Data(&local_40);
          pPVar9 = ParseNode::AsParseNodeRegExp(*ppPVar8);
          if (pPVar9->regexPattern == (RegexPattern *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar7 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                               ,0x306,"(pnode->AsParseNodeRegExp()->regexPattern != nullptr)",
                               "pnode->AsParseNodeRegExp()->regexPattern != nullptr");
            if (!bVar5) goto LAB_00ce389e;
            *puVar7 = 0;
          }
        }
      }
      local_48 = (BackgroundParseItem *)&local_48->nextItem;
    } while( true );
  }
  ppPVar8 = DListBase<ParseNode_*,_RealCount>::Iterator::Data(&local_40);
  pPVar11 = *ppPVar8;
  if (pPVar11->nop != knopRegExp) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                       ,0x2d0,"(pnodeFgnd->nop == knopRegExp)","pnodeFgnd->nop == knopRegExp");
    if (!bVar5) goto LAB_00ce389e;
    *puVar7 = 0;
    pPVar11 = *ppPVar8;
  }
  pPVar9 = ParseNode::AsParseNodeRegExp(pPVar11);
  if (pPVar9->regexPattern == (RegexPattern *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                       ,0x2d1,"(pnodeFgnd->AsParseNodeRegExp()->regexPattern != nullptr)",
                       "pnodeFgnd->AsParseNodeRegExp()->regexPattern != nullptr");
    if (!bVar5) goto LAB_00ce389e;
    *puVar7 = 0;
  }
  bVar5 = false;
LAB_00ce3635:
  if (!bVar5) {
    while( true ) {
      if (pBVar13 == (BackgroundParseItem *)0x0) {
        pBVar13 = (BackgroundParseItem *)0x0;
        goto LAB_00ce353c;
      }
      pNVar1 = pBVar13->regExpNodes;
      pNVar4 = pNVar1;
      if (pNVar1 != (NodeDList *)0x0) break;
      pBVar13 = pBVar13->nextItem;
    }
    do {
      local_58.current = (NodeBase *)pNVar4;
      local_58.list = &pNVar1->super_DListBase<ParseNode_*,_RealCount>;
      if ((NodeDList *)local_58.current == (NodeDList *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                           ,0x66,"(current != nullptr)","current != nullptr");
        if (!bVar6) goto LAB_00ce389e;
        *puVar7 = 0;
      }
      pNVar1 = (NodeDList *)
               (((DListBase<ParseNode_*,_RealCount> *)&(local_58.current)->next)->
               super_DListNodeBase<ParseNode_*>).next.base;
      if (pNVar1 == (NodeDList *)local_58.list) {
        pBVar13 = pBVar13->nextItem;
        goto LAB_00ce3635;
      }
      local_58.current = (NodeBase *)pNVar1;
      ppPVar10 = DListBase<ParseNode_*,_RealCount>::Iterator::Data(&local_58);
      pPVar11 = *ppPVar10;
      if (pPVar11->nop != knopRegExp) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                           ,0x2e3,"(pnodeBgnd->nop == knopRegExp)","pnodeBgnd->nop == knopRegExp");
        if (!bVar6) goto LAB_00ce389e;
        *puVar7 = 0;
        pPVar11 = *ppPVar10;
      }
      this_00 = *ppPVar8;
      pNVar1 = (NodeDList *)local_58.list;
      pNVar4 = (NodeDList *)local_58.current;
    } while (pPVar11->ichMin < this_00->ichMin);
    if (this_00->ichMin == pPVar11->ichMin) {
      if (this_00->ichLim != pPVar11->ichLim) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                           ,0x2eb,"(pnodeFgnd->ichLim == pnodeBgnd->ichLim)",
                           "pnodeFgnd->ichLim == pnodeBgnd->ichLim");
        if (!bVar5) goto LAB_00ce389e;
        *puVar7 = 0;
        this_00 = *ppPVar8;
      }
      pPVar9 = ParseNode::AsParseNodeRegExp(this_00);
      pRVar2 = pPVar9->regexPattern;
      pPVar9 = ParseNode::AsParseNodeRegExp(*ppPVar10);
      pPVar9->regexPattern = pRVar2;
    }
    bVar5 = true;
    goto LAB_00ce3635;
  }
  goto LAB_00ce353c;
}

Assistant:

void Parser::FinishBackgroundRegExpNodes()
{
    // We have a list of RegExp nodes that we saw on the UI thread in functions we're parallel parsing,
    // and for each background job we have a list of RegExp nodes for which we couldn't allocate patterns.
    // We need to copy the pattern pointers from the UI thread nodes to the corresponding nodes on the
    // background nodes.
    // There may be UI thread nodes for which there are no background thread equivalents, because the UI thread
    // has to assume that the background thread won't defer anything.

    // Note that because these lists (and the list of background jobs) are SList's built by prepending, they are
    // all in reverse lexical order.

    Assert(!this->IsBackgroundParser());
    Assert(this->fastScannedRegExpNodes);
    Assert(this->backgroundParseItems != nullptr);

    BackgroundParseItem *currBackgroundItem;

#if DBG
    for (currBackgroundItem = this->backgroundParseItems;
        currBackgroundItem;
        currBackgroundItem = currBackgroundItem->GetNext())
    {
        if (currBackgroundItem->RegExpNodeList())
        {
            FOREACH_DLIST_ENTRY(ParseNodePtr, ArenaAllocator, pnode, currBackgroundItem->RegExpNodeList())
            {
                Assert(pnode->AsParseNodeRegExp()->regexPattern == nullptr);
            }
            NEXT_DLIST_ENTRY;
        }
    }
#endif

    // Hook up the patterns allocated on the main thread to the nodes created on the background thread.
    // Walk the list of foreground nodes, advancing through the work items and looking up each item.
    // Note that the background thread may have chosen to defer a given RegEx literal, so not every foreground
    // node will have a matching background node. Doesn't matter for correctness.
    // (It's inefficient, of course, to have to restart the inner loop from the beginning of the work item's
    // list, but it should be unusual to have many RegExes in a single work item's chunk of code. Figure out how
    // to start the inner loop from a known internal node within the list if that turns out to be important.)
    currBackgroundItem = this->backgroundParseItems;
    FOREACH_DLIST_ENTRY(ParseNodePtr, ArenaAllocator, pnodeFgnd, this->fastScannedRegExpNodes)
    {
        Assert(pnodeFgnd->nop == knopRegExp);
        Assert(pnodeFgnd->AsParseNodeRegExp()->regexPattern != nullptr);
        bool quit = false;

        while (!quit)
        {
            // Find the next work item with a RegEx in it.
            while (currBackgroundItem && currBackgroundItem->RegExpNodeList() == nullptr)
            {
                currBackgroundItem = currBackgroundItem->GetNext();
            }
            if (!currBackgroundItem)
            {
                break;
            }

            // Walk the RegExps in the work item.
            FOREACH_DLIST_ENTRY(ParseNodePtr, ArenaAllocator, pnodeBgnd, currBackgroundItem->RegExpNodeList())
            {
                Assert(pnodeBgnd->nop == knopRegExp);

                if (pnodeFgnd->ichMin <= pnodeBgnd->ichMin)
                {
                    // Either we found a match, or the next background node is past the foreground node.
                    // In any case, we can stop searching.
                    if (pnodeFgnd->ichMin == pnodeBgnd->ichMin)
                    {
                        Assert(pnodeFgnd->ichLim == pnodeBgnd->ichLim);
                        pnodeBgnd->AsParseNodeRegExp()->regexPattern = pnodeFgnd->AsParseNodeRegExp()->regexPattern;
                    }
                    quit = true;
                    break;
                }
            }
            NEXT_DLIST_ENTRY;

            if (!quit)
            {
                // Need to advance to the next work item.
                currBackgroundItem = currBackgroundItem->GetNext();
            }
        }
    }
    NEXT_DLIST_ENTRY;

#if DBG
    for (currBackgroundItem = this->backgroundParseItems;
        currBackgroundItem;
        currBackgroundItem = currBackgroundItem->GetNext())
    {
        if (currBackgroundItem->RegExpNodeList())
        {
            FOREACH_DLIST_ENTRY(ParseNodePtr, ArenaAllocator, pnode, currBackgroundItem->RegExpNodeList())
            {
                Assert(pnode->AsParseNodeRegExp()->regexPattern != nullptr);
            }
            NEXT_DLIST_ENTRY;
        }
    }
#endif
}